

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_1391874::HandleRemoveImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool recurse,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *this;
  undefined1 in_AL;
  bool bVar3;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  string *psVar4;
  Status SVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long *plVar8;
  pointer pbVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string fileName;
  string r;
  char *__end;
  string local_108;
  cmExecutionStatus *local_e8;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  char *local_40;
  char *local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
  if (pbVar9 != pbVar1) {
    local_38 = "REMOVE";
    if (recurse) {
      local_38 = "REMOVE_RECURSE";
    }
    local_40 = local_38 + (ulong)recurse * 8 + 6;
    local_e8 = status;
    do {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pcVar2 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar2,pcVar2 + pbVar9->_M_string_length);
      if (local_108._M_string_length == 0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,local_38,local_40);
        this = local_e8->Makefile;
        std::operator+(&local_e0,"Ignoring empty file name in ",&local_88);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_e0);
        plVar8 = plVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar8) {
          local_c0.field_2._M_allocated_capacity = *plVar8;
          local_c0.field_2._8_8_ = plVar6[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *plVar8;
          local_c0._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_c0._M_string_length = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        cmMakefile::IssueMessage(this,AUTHOR_WARNING,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          (ulong)(local_c0.field_2._M_allocated_capacity + 1));
        }
        paVar7 = &local_e0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != paVar7) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          paVar7 = extraout_RAX;
        }
        in_AL = SUB81(paVar7,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          in_AL = extraout_AL;
        }
      }
      else {
        bVar3 = cmsys::SystemTools::FileIsFullPath(&local_108);
        if (!bVar3) {
          psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_e8->Makefile);
          local_88._M_string_length = (size_type)(psVar4->_M_dataplus)._M_p;
          local_88._M_dataplus._M_p = (pointer)psVar4->_M_string_length;
          local_88.field_2._M_allocated_capacity = 0;
          local_c0._M_dataplus._M_p = (pointer)0x0;
          local_c0._M_string_length = 1;
          local_c0.field_2._M_allocated_capacity = (long)&local_c0.field_2 + 8;
          local_c0.field_2._M_local_buf[8] = 0x2f;
          local_88.field_2._8_8_ = 1;
          local_60 = 0;
          local_50 = (pbVar9->_M_dataplus)._M_p;
          local_58 = pbVar9->_M_string_length;
          local_48 = 0;
          views._M_len = 3;
          views._M_array = (iterator)&local_88;
          local_68 = (undefined1 *)local_c0.field_2._M_allocated_capacity;
          cmCatViews(&local_e0,views);
          std::__cxx11::string::operator=((string *)&local_108,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
        bVar3 = cmsys::SystemTools::FileIsDirectory(&local_108);
        if ((!bVar3) || (bVar3 = cmsys::SystemTools::FileIsSymlink(&local_108), bVar3 || !recurse))
        {
          SVar5 = cmsys::SystemTools::RemoveFile(&local_108);
          in_AL = (undefined1)SVar5.Kind_;
        }
        else {
          in_AL = cmSystemTools::RepeatedRemoveDirectory(&local_108);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        in_AL = extraout_AL_00;
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != pbVar1);
  }
  return (bool)in_AL;
}

Assistant:

bool HandleRemoveImpl(std::vector<std::string> const& args, bool recurse,
                      cmExecutionStatus& status)
{
  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string fileName = arg;
    if (fileName.empty()) {
      std::string const r = recurse ? "REMOVE_RECURSE" : "REMOVE";
      status.GetMakefile().IssueMessage(
        MessageType::AUTHOR_WARNING, "Ignoring empty file name in " + r + ".");
      continue;
    }
    if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
      fileName =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }

    if (cmSystemTools::FileIsDirectory(fileName) &&
        !cmSystemTools::FileIsSymlink(fileName) && recurse) {
      cmSystemTools::RepeatedRemoveDirectory(fileName);
    } else {
      cmSystemTools::RemoveFile(fileName);
    }
  }
  return true;
}